

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

TCPConnection * __thiscall TCPConnection::Listen(TCPConnection *this)

{
  TCPConnection *pTVar1;
  
  pTVar1 = this->NewConnection;
  if (pTVar1 == (TCPConnection *)0x0) {
    do {
      osEvent::Wait(&this->Event,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                    ,0xf7,-1);
      pTVar1 = this->NewConnection;
    } while (pTVar1 == (TCPConnection *)0x0);
  }
  this->NewConnection = (TCPConnection *)0x0;
  return pTVar1;
}

Assistant:

TCPConnection* TCPConnection::Listen()
{
    TCPConnection* connection;

    while (NewConnection == nullptr)
    {
        Event.Wait(__FILE__, __LINE__);
    }
    connection = NewConnection;
    NewConnection = nullptr;

    return connection;
}